

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.h
# Opt level: O2

uint getWRegFromXReg(uint Reg)

{
  uint uVar1;
  
  switch(Reg) {
  case 199:
    Reg = 0xa8;
switchD_00169267_caseD_3:
    return Reg;
  case 200:
    return 0xa9;
  case 0xc9:
    return 0xaa;
  case 0xca:
    return 0xab;
  case 0xcb:
    return 0xac;
  case 0xcc:
    return 0xad;
  case 0xcd:
    return 0xae;
  case 0xce:
    return 0xaf;
  case 0xcf:
    return 0xb0;
  case 0xd0:
    return 0xb1;
  case 0xd1:
    return 0xb2;
  case 0xd2:
    return 0xb3;
  case 0xd3:
    return 0xb4;
  case 0xd4:
    return 0xb5;
  case 0xd5:
    return 0xb6;
  case 0xd6:
    return 0xb7;
  case 0xd7:
    return 0xb8;
  case 0xd8:
    return 0xb9;
  case 0xd9:
    return 0xba;
  case 0xda:
    return 0xbb;
  case 0xdb:
    return 0xbc;
  case 0xdc:
    return 0xbd;
  case 0xdd:
    return 0xbe;
  case 0xde:
    return 0xbf;
  case 0xdf:
    return 0xc0;
  case 0xe0:
    return 0xc1;
  case 0xe1:
    return 0xc2;
  case 0xe2:
    return 0xc3;
  case 0xe3:
    return 0xc4;
  }
  switch(Reg) {
  case 1:
    return 0xc5;
  case 2:
    return 0xc6;
  default:
    goto switchD_00169267_caseD_3;
  case 4:
    uVar1 = 5;
    break;
  case 7:
    uVar1 = 6;
  }
  return uVar1;
}

Assistant:

inline static unsigned getWRegFromXReg(unsigned Reg)
{
	switch (Reg) {
		case ARM64_REG_X0: return ARM64_REG_W0;
		case ARM64_REG_X1: return ARM64_REG_W1;
		case ARM64_REG_X2: return ARM64_REG_W2;
		case ARM64_REG_X3: return ARM64_REG_W3;
		case ARM64_REG_X4: return ARM64_REG_W4;
		case ARM64_REG_X5: return ARM64_REG_W5;
		case ARM64_REG_X6: return ARM64_REG_W6;
		case ARM64_REG_X7: return ARM64_REG_W7;
		case ARM64_REG_X8: return ARM64_REG_W8;
		case ARM64_REG_X9: return ARM64_REG_W9;
		case ARM64_REG_X10: return ARM64_REG_W10;
		case ARM64_REG_X11: return ARM64_REG_W11;
		case ARM64_REG_X12: return ARM64_REG_W12;
		case ARM64_REG_X13: return ARM64_REG_W13;
		case ARM64_REG_X14: return ARM64_REG_W14;
		case ARM64_REG_X15: return ARM64_REG_W15;
		case ARM64_REG_X16: return ARM64_REG_W16;
		case ARM64_REG_X17: return ARM64_REG_W17;
		case ARM64_REG_X18: return ARM64_REG_W18;
		case ARM64_REG_X19: return ARM64_REG_W19;
		case ARM64_REG_X20: return ARM64_REG_W20;
		case ARM64_REG_X21: return ARM64_REG_W21;
		case ARM64_REG_X22: return ARM64_REG_W22;
		case ARM64_REG_X23: return ARM64_REG_W23;
		case ARM64_REG_X24: return ARM64_REG_W24;
		case ARM64_REG_X25: return ARM64_REG_W25;
		case ARM64_REG_X26: return ARM64_REG_W26;
		case ARM64_REG_X27: return ARM64_REG_W27;
		case ARM64_REG_X28: return ARM64_REG_W28;
		case ARM64_REG_FP: return ARM64_REG_W29;
		case ARM64_REG_LR: return ARM64_REG_W30;
		case ARM64_REG_SP: return ARM64_REG_WSP;
		case ARM64_REG_XZR: return ARM64_REG_WZR;
	}

	// For anything else, return it unchanged.
	return Reg;
}